

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_server_stop(nni_http_server *s)

{
  http_sconn *local_18;
  http_sconn *sc;
  nni_http_server *s_local;
  
  http_server_close(s);
  for (local_18 = (http_sconn *)nni_list_first(&s->conns); local_18 != (http_sconn *)0x0;
      local_18 = (http_sconn *)nni_list_next(&s->conns,local_18)) {
    http_sconn_close(local_18);
  }
  return;
}

Assistant:

static void
http_server_stop(nni_http_server *s)
{
	http_sconn *sc;

	http_server_close(s);

	// Stopping the server is a hard stop -- it aborts any work
	// being done by clients.  (No graceful shutdown).
	NNI_LIST_FOREACH (&s->conns, sc) {
		http_sconn_close(sc);
	}
}